

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::SpectrumImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,pbrt::MIPMapFilterOptions&,pbrt::WrapMode&,float&,bool&,pbrt::ColorEncodingHandle&,pbrt::SpectrumType&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,SpectrumImageTexture *p,
          TextureMapping2DHandle *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          MIPMapFilterOptions *args_2,WrapMode *args_3,float *args_4,bool *args_5,
          ColorEncodingHandle *args_6,SpectrumType *args_7,polymorphic_allocator<std::byte> *args_8)

{
  uintptr_t local_60;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_58;
  string local_50;
  
  local_58.bits =
       (args->
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       ).bits;
  std::__cxx11::string::string((string *)&local_50,(string *)args_1);
  local_60 = (args_6->
             super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             ).bits;
  pbrt::SpectrumImageTexture::SpectrumImageTexture
            (p,(TextureMapping2DHandle *)&local_58,&local_50,*args_2,*args_3,*args_4,*args_5,
             (ColorEncodingHandle)&local_60,*args_7,args_8->memoryResource);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }